

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::TestCaseInfo::tagsAsString_abi_cxx11_(string *__return_storage_ptr__,TestCaseInfo *this)

{
  bool bVar1;
  size_type sVar2;
  StringRef *this_00;
  reference pTVar3;
  size_type sVar4;
  StringRef rhs;
  Tag *tag_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1_1;
  Tag *tag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1;
  size_t full_size;
  TestCaseInfo *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar2 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::size(&this->tags);
  sVar4 = sVar2 << 1;
  __end1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(&this->tags);
  tag = (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(&this->tags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                                     *)&tag), bVar1) {
    this_00 = &__gnu_cxx::
               __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
               ::operator*(&__end1)->original;
    StringRef::size(this_00);
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1_1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(&this->tags);
  tag_1 = (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(&this->tags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)&tag_1), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    rhs.m_size = sVar4;
    rhs.m_start = (char *)(pTVar3->original).m_size;
    Catch::operator+=((Catch *)__return_storage_ptr__,(string *)(pTVar3->original).m_start,rhs);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseInfo::tagsAsString() const {
        std::string ret;
        // '[' and ']' per tag
        std::size_t full_size = 2 * tags.size();
        for (const auto& tag : tags) {
            full_size += tag.original.size();
        }
        ret.reserve(full_size);
        for (const auto& tag : tags) {
            ret.push_back('[');
            ret += tag.original;
            ret.push_back(']');
        }

        return ret;
    }